

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

bool __thiscall
pbrt::ParseArg<pstd::span<float>>
          (pbrt *this,char ***argv,string *name,span<float> out,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *onError)

{
  long lVar1;
  char *__s;
  bool bVar2;
  __type_conflict _Var3;
  size_t sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  span<float> out_00;
  span<float> out_01;
  string value;
  string arg;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)out.n;
  pbVar5 = this_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&arg,(char *)**(undefined8 **)this,(allocator<char> *)&value);
  if (arg._M_dataplus._M_p[1] == '-') {
    std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
  }
  else {
    std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
  }
  std::__cxx11::string::operator=((string *)&arg,(string *)&value);
  std::__cxx11::string::~string((string *)&value);
  anon_unknown_4::normalizeArg(&value,&arg);
  std::operator+(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argv
                 ,'=');
  anon_unknown_4::normalizeArg(&local_b0,&local_50);
  bVar2 = anon_unknown_4::matchPrefix(&value,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&value);
  if (bVar2) {
    *(long *)this = *(long *)this + 8;
    sVar4 = 0xffffffffffffffff;
    std::__cxx11::string::substr((ulong)&value,(ulong)&arg);
    out_00.n = sVar4;
    out_00.ptr = out.ptr;
    bVar2 = anon_unknown_4::initArg((anon_unknown_4 *)&value,name,out_00);
    if (!bVar2) {
      StringPrintf<std::__cxx11::string&,std::__cxx11::string_const&>
                (&local_70,(pbrt *)"invalid value \"%s\" for %s argument",(char *)&value,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argv,pbVar5);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)this_00,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::~string((string *)&value);
  }
  else {
    anon_unknown_4::normalizeArg(&value,&arg);
    anon_unknown_4::normalizeArg(&local_b0,(string *)argv);
    _Var3 = std::operator==(&value,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&value);
    if (_Var3) {
      lVar1 = *(long *)this;
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar1 + 8);
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)this = pbVar5;
      __s = *(char **)(lVar1 + 8);
      if (__s != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&value,__s,(allocator<char> *)&local_b0);
        out_01.n = (size_t)pbVar5;
        out_01.ptr = out.ptr;
        anon_unknown_4::initArg((anon_unknown_4 *)&value,name,out_01);
        std::__cxx11::string::~string((string *)&value);
        *(long *)this = *(long *)this + 8;
        bVar2 = true;
        goto LAB_0026a4a1;
      }
      StringPrintf<std::__cxx11::string&>
                (&local_90,(pbrt *)"missing value after %s argument",(char *)&arg,pbVar5);
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::operator()((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    bVar2 = false;
  }
LAB_0026a4a1:
  std::__cxx11::string::~string((string *)&arg);
  return bVar2;
}

Assistant:

bool ParseArg(char ***argv, const std::string &name, T out,
              std::function<void(std::string)> onError) {
    std::string arg = **argv;

    // Strip either one or two leading dashes.
    if (arg[1] == '-')
        arg = arg.substr(2);
    else
        arg = arg.substr(1);

    if (matchPrefix(normalizeArg(arg), normalizeArg(name + '='))) {
        // --arg=value
        *argv += 1;
        std::string value = arg.substr(name.size() + 1);
        if (!initArg(value, out)) {
            onError(StringPrintf("invalid value \"%s\" for %s argument", value, name));
            return false;
        }
        return true;
    } else if (normalizeArg(arg) == normalizeArg(name)) {
        // --arg <value>, except for bool arguments, which are set to true
        // without expecting another argument.
        *argv += 1;
        if (enable(out))
            return true;

        if (**argv == nullptr) {
            onError(StringPrintf("missing value after %s argument", arg));
            return false;
        }
        initArg(**argv, out);
        *argv += 1;
        return true;
    } else
        return false;
}